

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O0

void __thiscall
ymfm::fm_operator<ymfm::opn_registers_base<false>_>::clock_phase
          (fm_operator<ymfm::opn_registers_base<false>_> *this,int32_t lfo_raw_pm)

{
  uint32_t local_18;
  uint32_t phase_step;
  int32_t lfo_raw_pm_local;
  fm_operator<ymfm::opn_registers_base<false>_> *this_local;
  
  local_18 = (this->m_cache).phase_step;
  if (local_18 == 1) {
    local_18 = opn_registers_base<false>::compute_phase_step
                         (this->m_regs,this->m_choffs,this->m_opoffs,&this->m_cache,lfo_raw_pm);
  }
  this->m_phase = local_18 + this->m_phase;
  return;
}

Assistant:

void fm_operator<RegisterType>::clock_phase(int32_t lfo_raw_pm)
{
	// read from the cache, or recalculate if PM active
	uint32_t phase_step = m_cache.phase_step;
	if (phase_step == opdata_cache::PHASE_STEP_DYNAMIC)
		phase_step = m_regs.compute_phase_step(m_choffs, m_opoffs, m_cache, lfo_raw_pm);

	// finally apply the step to the current phase value
	m_phase += phase_step;
}